

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

int secp256k1_ge_is_valid_var(secp256k1_ge *a)

{
  secp256k1_ge *in_RDI;
  secp256k1_fe x3;
  secp256k1_fe y2;
  secp256k1_fe *in_stack_ffffffffffffff98;
  secp256k1_fe *in_stack_ffffffffffffffa0;
  secp256k1_fe *in_stack_ffffffffffffffb8;
  secp256k1_fe *in_stack_ffffffffffffffc0;
  int local_4;
  
  secp256k1_ge_verify(in_RDI);
  if (in_RDI->infinity == 0) {
    secp256k1_fe_impl_sqr(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    secp256k1_fe_impl_sqr(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    secp256k1_fe_impl_mul
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(secp256k1_fe *)0x10b7bc);
    secp256k1_fe_impl_add_int((secp256k1_fe *)&stack0xffffffffffffffa0,7);
    local_4 = secp256k1_fe_equal_var(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int secp256k1_ge_is_valid_var(const secp256k1_ge *a) {
    secp256k1_fe y2, x3;
    secp256k1_ge_verify(a);
    if (a->infinity) {
        return 0;
    }
    /* y^2 = x^3 + 7 */
    secp256k1_fe_sqr(&y2, &a->y);
    secp256k1_fe_sqr(&x3, &a->x); secp256k1_fe_mul(&x3, &x3, &a->x);
    secp256k1_fe_add_int(&x3, SECP256K1_B);
    return secp256k1_fe_equal_var(&y2, &x3);
}